

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathErr(xmlXPathParserContextPtr ctxt,int error)

{
  xmlChar *pxVar1;
  int local_24;
  int error_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((error < 0) || (local_24 = error, 0x1b < error)) {
    local_24 = 0x1b;
  }
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0xc,local_24 + 0x4b0,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,
                    (char *)0x0,(char *)0x0,0,0,"%s",xmlXPathErrorMessages[local_24]);
  }
  else {
    ctxt->error = local_24;
    if (ctxt->context == (xmlXPathContextPtr)0x0) {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0xc,local_24 + 0x4b0,XML_ERR_ERROR,(char *)0x0,0,
                      (char *)ctxt->base,(char *)0x0,(char *)0x0,(int)ctxt->cur - (int)ctxt->base,0,
                      "%s",xmlXPathErrorMessages[local_24]);
    }
    else {
      xmlResetError(&ctxt->context->lastError);
      (ctxt->context->lastError).domain = 0xc;
      (ctxt->context->lastError).code = local_24 + 0x4b0;
      (ctxt->context->lastError).level = XML_ERR_ERROR;
      pxVar1 = xmlStrdup(ctxt->base);
      (ctxt->context->lastError).str1 = (char *)pxVar1;
      (ctxt->context->lastError).int1 = (int)ctxt->cur - (int)ctxt->base;
      (ctxt->context->lastError).node = ctxt->context->debugNode;
      if (ctxt->context->error == (xmlStructuredErrorFunc)0x0) {
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,ctxt->context->debugNode,0xc,local_24 + 0x4b0,XML_ERR_ERROR,(char *)0x0,0,
                        (char *)ctxt->base,(char *)0x0,(char *)0x0,(int)ctxt->cur - (int)ctxt->base,
                        0,"%s",xmlXPathErrorMessages[local_24]);
      }
      else {
        (*ctxt->context->error)(ctxt->context->userData,&ctxt->context->lastError);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathErr(xmlXPathParserContextPtr ctxt, int error)
{
    if ((error < 0) || (error > MAXERRNO))
	error = MAXERRNO;
    if (ctxt == NULL) {
	__xmlRaiseError(NULL, NULL, NULL,
			NULL, NULL, XML_FROM_XPATH,
			error + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
			XML_ERR_ERROR, NULL, 0,
			NULL, NULL, NULL, 0, 0,
			"%s", xmlXPathErrorMessages[error]);
	return;
    }
    ctxt->error = error;
    if (ctxt->context == NULL) {
	__xmlRaiseError(NULL, NULL, NULL,
			NULL, NULL, XML_FROM_XPATH,
			error + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
			XML_ERR_ERROR, NULL, 0,
			(const char *) ctxt->base, NULL, NULL,
			ctxt->cur - ctxt->base, 0,
			"%s", xmlXPathErrorMessages[error]);
	return;
    }

    /* cleanup current last error */
    xmlResetError(&ctxt->context->lastError);

    ctxt->context->lastError.domain = XML_FROM_XPATH;
    ctxt->context->lastError.code = error + XML_XPATH_EXPRESSION_OK -
                           XPATH_EXPRESSION_OK;
    ctxt->context->lastError.level = XML_ERR_ERROR;
    ctxt->context->lastError.str1 = (char *) xmlStrdup(ctxt->base);
    ctxt->context->lastError.int1 = ctxt->cur - ctxt->base;
    ctxt->context->lastError.node = ctxt->context->debugNode;
    if (ctxt->context->error != NULL) {
	ctxt->context->error(ctxt->context->userData,
	                     &ctxt->context->lastError);
    } else {
	__xmlRaiseError(NULL, NULL, NULL,
			NULL, ctxt->context->debugNode, XML_FROM_XPATH,
			error + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
			XML_ERR_ERROR, NULL, 0,
			(const char *) ctxt->base, NULL, NULL,
			ctxt->cur - ctxt->base, 0,
			"%s", xmlXPathErrorMessages[error]);
    }

}